

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

void __thiscall Game::assignMonsters(Game *this)

{
  Player *this_00;
  Game *pGVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  string *psVar3;
  ostream *poVar4;
  vector<MonsterCards,_std::allocator<MonsterCards>_> *pvVar5;
  pointer ppPVar6;
  long lVar7;
  int option;
  uint local_12c;
  void *local_128;
  iterator iStack_120;
  int *local_118;
  Game *local_110;
  pointer local_108;
  pointer local_100;
  MonsterCards local_f8;
  
  local_108 = players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_110 = this;
  if (players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_00113146:
    pGVar1 = local_110;
    if (0 < local_110->numberOfPlayers) {
      lVar7 = 0;
      do {
        poVar4 = operator<<((ostream *)&std::cout,
                            players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        lVar7 = lVar7 + 1;
      } while (lVar7 < pGVar1->numberOfPlayers);
    }
    return;
  }
  ppPVar6 = players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
            super__Vector_impl_data._M_start;
LAB_00112f97:
  this_00 = *ppPVar6;
  local_128 = (void *)0x0;
  iStack_120._M_current = (int *)0x0;
  local_118 = (int *)0x0;
  local_12c = 0xffffffff;
  local_100 = ppPVar6;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  do {
    if (local_12c < 6) {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (local_128,iStack_120._M_current,&local_12c);
      if (_Var2._M_current == iStack_120._M_current) break;
    }
    local_12c = 0xffffffff;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player :",8);
    psVar3 = Player::getPlayerName_abi_cxx11_(this_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," , please select an UNASSIGNED Monster card (index)",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    poVar4 = operator<<((ostream *)&std::cout,&this->deckOfMonsterCards);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,(int *)&local_12c);
  } while( true );
  if (iStack_120._M_current == local_118) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_128,iStack_120,(int *)&local_12c);
  }
  else {
    *iStack_120._M_current = local_12c;
    iStack_120._M_current = iStack_120._M_current + 1;
  }
  pvVar5 = DeckOfMonsterCards::getDeck(&this->deckOfMonsterCards);
  MonsterCards::MonsterCards
            (&local_f8,
             (pvVar5->super__Vector_base<MonsterCards,_std::allocator<MonsterCards>_>)._M_impl.
             super__Vector_impl_data._M_start + (int)local_12c);
  Player::assignMonster(this_00,&local_f8);
  MonsterCards::~MonsterCards(&local_f8);
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  ppPVar6 = local_100 + 1;
  if (ppPVar6 == local_108) goto LAB_00113146;
  goto LAB_00112f97;
}

Assistant:

void Game::assignMonsters(){
    for(auto player : players){
        vector<int> assigned;
        int option = -1;
        cout << endl;

        while(option < 0 || option >5 || find(assigned.begin(), assigned.end(),option)!=assigned.end()){
            option = -1;
            cout<< "Player :" << player->getPlayerName() << " , please select an UNASSIGNED Monster card (index)" << endl;
            cout << deckOfMonsterCards << endl;
            cin >> option;
        }
        assigned.push_back(option);
        player->assignMonster(deckOfMonsterCards.getDeck()[option]);
    }

    for (int i=0; i< numberOfPlayers; i++){
        cout << players[i] << endl;
    }
}